

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O0

void __thiscall yactfr::internal::PktProcBuilder::_insertEndInstrs(PktProcBuilder *this)

{
  bool bVar1;
  pointer pPVar2;
  Proc *pPVar3;
  DsPktProcs *this_00;
  pointer pDVar4;
  anon_class_1_0_00000001 local_39;
  unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
  *local_38;
  unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
  *dsPktProc;
  pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>
  *dsPktProcPair;
  iterator __end2;
  iterator __begin2;
  DsPktProcs *__range2;
  PktProcBuilder *this_local;
  
  pPVar2 = std::
           unique_ptr<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>::
           operator->(&this->_pktProc);
  pPVar3 = PktProc::preambleProc(pPVar2);
  insertEndInstr<yactfr::internal::EndPktPreambleProcInstr>(pPVar3);
  pPVar2 = std::
           unique_ptr<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>::
           operator->(&this->_pktProc);
  this_00 = PktProc::dsPktProcs(pPVar2);
  __end2 = std::
           unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>_>_>
           ::begin(this_00);
  dsPktProcPair =
       (pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>
        *)std::
          unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false>
                         *)&dsPktProcPair);
    if (!bVar1) break;
    dsPktProc = (unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
                 *)std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false,_false>
                   ::operator*(&__end2);
    local_38 = &((reference)dsPktProc)->second;
    pDVar4 = std::
             unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
             ::operator->(local_38);
    pPVar3 = DsPktProc::pktPreambleProc(pDVar4);
    insertEndInstr<yactfr::internal::EndDsPktPreambleProcInstr>(pPVar3);
    pDVar4 = std::
             unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
             ::operator->(local_38);
    pPVar3 = DsPktProc::erPreambleProc(pDVar4);
    insertEndInstr<yactfr::internal::EndDsErPreambleProcInstr>(pPVar3);
    pDVar4 = std::
             unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
             ::operator->(local_38);
    DsPktProc::forEachErProc<yactfr::internal::PktProcBuilder::_insertEndInstrs()::__0>
              (pDVar4,&local_39);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void PktProcBuilder::_insertEndInstrs()
{
    insertEndInstr<EndPktPreambleProcInstr>(_pktProc->preambleProc());

    for (auto& dsPktProcPair : _pktProc->dsPktProcs()) {
        auto& dsPktProc = dsPktProcPair.second;

        insertEndInstr<EndDsPktPreambleProcInstr>(dsPktProc->pktPreambleProc());
        insertEndInstr<EndDsErPreambleProcInstr>(dsPktProc->erPreambleProc());

        dsPktProc->forEachErProc([](ErProc& erProc) {
            insertEndInstr<EndErProcInstr>(erProc.proc());
        });
    }
}